

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedTokenWithin
          (DiagnosticsReporter *this,
          vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds)

{
  SyntaxToken *this_00;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *in_RDX;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  string local_170 [32];
  DiagnosticDescriptor local_150;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string s;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds_local;
  DiagnosticsReporter *this_local;
  
  s.field_2._8_8_ = validTkKinds;
  joinTokenNames_abi_cxx11_(&local_b8,(DiagnosticsReporter *)validTkKinds,in_RDX);
  std::operator+(&local_98,"expected ",&local_b8);
  std::operator+(&local_78,&local_98,", got `");
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_e8,this_00);
  std::operator+(&local_58,&local_78,&local_e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"\'");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string(local_170,(string *)&ID_of_ExpectedTokenWithin_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"[[expected one of tokens]]",&local_191);
  std::__cxx11::string::string(local_1b8,(string *)local_38);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_150,local_170,local_190,local_1b8,2,1);
  diagnoseOrDelayDiagnostic(this,&local_150);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_150);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedTokenWithin(const std::vector<SyntaxKind>& validTkKinds)
{
    std::string s = "expected "
            + joinTokenNames(validTkKinds)
            + ", got `"
            + parser_->peek().valueText()
            + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedTokenWithin,
                                     "[[expected one of tokens]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}